

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

size_t CLI::detail::close_sequence(string *str,size_t start,char closure_char)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  ulong local_70;
  size_t loc;
  allocator local_51;
  string local_50 [8];
  string closures;
  size_type bracket_loc;
  char closure_char_local;
  size_t start_local;
  string *str_local;
  
  closures.field_2._8_8_ = ::std::__cxx11::string::find('8',(ulong)(uint)(int)closure_char);
  if (closures.field_2._8_8_ != -1) {
    if (closures.field_2._8_8_ == 0) {
      sVar2 = close_string_quote(str,start,closure_char);
      return sVar2;
    }
    if (1 < closures.field_2._8_8_ - 1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_50,1,closure_char,&local_51);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
      for (local_70 = start + 1; uVar3 = ::std::__cxx11::string::size(), local_70 < uVar3;
          local_70 = local_70 + 1) {
        pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)str);
        cVar1 = *pcVar4;
        pcVar4 = (char *)::std::__cxx11::string::back();
        if (cVar1 == *pcVar4) {
          ::std::__cxx11::string::pop_back();
          uVar3 = ::std::__cxx11::string::empty();
          if ((uVar3 & 1) != 0) goto LAB_00144027;
        }
        pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)str);
        closures.field_2._8_8_ = ::std::__cxx11::string::find('\x18',(ulong)(uint)(int)*pcVar4);
        if (closures.field_2._8_8_ != -1) {
          if (closures.field_2._8_8_ == 0) {
            pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)str);
            local_70 = close_string_quote(str,local_70,*pcVar4);
          }
          else if (closures.field_2._8_8_ - 1 < 2) {
            pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)str);
            local_70 = close_literal_quote(str,local_70,*pcVar4);
          }
          else {
            ::std::__cxx11::string::operator[](0x182538);
            ::std::__cxx11::string::push_back((char)local_50);
          }
        }
      }
      uVar3 = ::std::__cxx11::string::size();
      if (uVar3 < local_70) {
        local_70 = ::std::__cxx11::string::size();
      }
LAB_00144027:
      ::std::__cxx11::string::~string(local_50);
      return local_70;
    }
  }
  sVar2 = close_literal_quote(str,start,closure_char);
  return sVar2;
}

Assistant:

CLI11_INLINE std::size_t close_sequence(const std::string &str, std::size_t start, char closure_char) {

    auto bracket_loc = matchBracketChars.find(closure_char);
    switch(bracket_loc) {
    case 0:
        return close_string_quote(str, start, closure_char);
    case 1:
    case 2:
#if defined(_MSC_VER) && _MSC_VER < 1920
    case(std::size_t)-1:
#else
    case std::string::npos:
#endif
        return close_literal_quote(str, start, closure_char);
    default:
        break;
    }

    std::string closures(1, closure_char);
    auto loc = start + 1;

    while(loc < str.size()) {
        if(str[loc] == closures.back()) {
            closures.pop_back();
            if(closures.empty()) {
                return loc;
            }
        }
        bracket_loc = bracketChars.find(str[loc]);
        if(bracket_loc != std::string::npos) {
            switch(bracket_loc) {
            case 0:
                loc = close_string_quote(str, loc, str[loc]);
                break;
            case 1:
            case 2:
                loc = close_literal_quote(str, loc, str[loc]);
                break;
            default:
                closures.push_back(matchBracketChars[bracket_loc]);
                break;
            }
        }
        ++loc;
    }
    if(loc > str.size()) {
        loc = str.size();
    }
    return loc;
}